

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogTailIdx.cpp
# Opt level: O3

void __thiscall liblogger::LogTailIdx::LogTailIdx(LogTailIdx *this,size_t length)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_ILogger)._vptr_ILogger = (_func_int **)&PTR__LogTailIdx_001448e0;
  this->m_length = length;
  this->m_current = 0;
  p_Var1 = &(this->m_data)._M_t._M_impl.super__Rb_tree_header;
  (this->m_data)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_data)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_data)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_data)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_data)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

LogTailIdx::LogTailIdx(size_t length) :
	m_length(length),
	m_current(0)
{

}